

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O1

ktx_error_code_e ktxTexture_IterateLevelFaces(ktxTexture *This,PFNKTXITERCB iterCb,void *userdata)

{
  uint uVar1;
  uint uVar2;
  ktx_error_code_e kVar3;
  ktx_size_t kVar4;
  byte bVar5;
  ktx_uint32_t kVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  uint local_54;
  ktx_size_t offset;
  
  kVar3 = KTX_INVALID_VALUE;
  if (iterCb != (PFNKTXITERCB)0x0 && This != (ktxTexture *)0x0) {
    if (This->numLevels == 0) {
      kVar3 = KTX_SUCCESS;
    }
    else {
      kVar6 = 0;
      kVar3 = KTX_SUCCESS;
      do {
        bVar5 = (byte)kVar6;
        uVar1 = This->baseWidth >> (bVar5 & 0x1f);
        uVar2 = This->baseHeight >> (bVar5 & 0x1f);
        uVar8 = This->baseDepth >> (bVar5 & 0x1f);
        kVar4 = (*(This->_protected->_vtbl).calcFaceLodSize)(This,kVar6);
        local_54 = 1;
        if ((This->isCubemap == true) && (This->isArray == false)) {
          local_54 = This->numFaces;
        }
        if (local_54 != 0) {
          uVar7 = 1;
          do {
            (*This->vtbl->GetImageOffset)(This,kVar6,0,uVar7 - 1,&offset);
            kVar3 = (*iterCb)(kVar6,uVar7 - 1,uVar1 + (uVar1 == 0),uVar2 + (uVar2 == 0),
                              uVar8 + (uVar8 == 0),(ktx_uint64_t)kVar4,This->pData + offset,userdata
                             );
            if (kVar3 != KTX_SUCCESS) break;
            bVar9 = uVar7 < local_54;
            uVar7 = uVar7 + 1;
          } while (bVar9);
        }
        kVar6 = kVar6 + 1;
      } while (kVar6 < This->numLevels);
    }
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture_IterateLevelFaces(ktxTexture* This, PFNKTXITERCB iterCb,
                             void* userdata)
{
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        ktx_uint32_t faceLodSize;
        ktx_uint32_t face;
        ktx_uint32_t innerIterations;
        GLsizei      width, height, depth;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        faceLodSize = (ktx_uint32_t)ktxTexture_calcFaceLodSize(
                                                    This, miplevel);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        if (This->isCubemap && !This->isArray)
            innerIterations = This->numFaces;
        else
            innerIterations = 1;
        for (face = 0; face < innerIterations; ++face)
        {
            /* And all z_slices are also passed as a group hence no
             *    for (slice = 0; slice < This->depth)
             */
            ktx_size_t offset;

            ktxTexture_GetImageOffset(This, miplevel, 0, face, &offset);
            result = iterCb(miplevel, face,
                            width, height, depth,
                            faceLodSize, This->pData + offset, userdata);

            if (result != KTX_SUCCESS)
                break;
        }
    }

    return result;
}